

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

Node * __thiscall wabt::Node::operator=(Node *this,Node *rhs)

{
  ExprType EVar1;
  
  EVar1 = rhs->etype;
  this->ntype = rhs->ntype;
  this->etype = EVar1;
  rhs->ntype = Uninitialized;
  rhs->etype = Nop;
  this->e = rhs->e;
  std::_Vector_base<wabt::Node,_std::allocator<wabt::Node>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->children,(_Vector_impl_data *)&rhs->children);
  this->u = rhs->u;
  return this;
}

Assistant:

Node& operator=(Node&& rhs) {
    ntype = rhs.ntype;
    // Reset ntype to avoid moved from values still being used.
    rhs.ntype = NodeType::Uninitialized;
    etype = rhs.etype;
    rhs.etype = ExprType::Nop;
    e = rhs.e;
    std::swap(children, rhs.children);
    u = rhs.u;
    return *this;
  }